

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O2

int Abc_NtkConvertToBlifMv(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Mem_Flex_t *pMmMan;
  Vec_Str_t *vCube;
  char *pcVar4;
  Abc_Obj_t *pNode;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte bVar11;
  byte *pbVar12;
  char *pSop1;
  char *pSop0;
  byte *pbVar7;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x3c6,"int Abc_NtkConvertToBlifMv(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkToBdd(pNtk);
  if (iVar1 == 0) {
    puts("Converting logic functions to BDDs has failed.");
    iVar1 = 0;
  }
  else {
    pMmMan = Mem_FlexStart();
    vCube = (Vec_Str_t *)malloc(0x10);
    vCube->nCap = 100;
    vCube->nSize = 0;
    pcVar4 = (char *)malloc(100);
    vCube->pArray = pcVar4;
    for (iVar1 = 0; iVar1 < pNtk->vObjs->nSize; iVar1 = iVar1 + 1) {
      pNode = Abc_NtkObj(pNtk,iVar1);
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Abc_NodeBddToCnf(pNode,pMmMan,vCube,0,&pSop0,&pSop1);
        iVar2 = Abc_SopGetCubeNum(pSop0);
        iVar3 = Abc_SopGetCubeNum(pSop1);
        pbVar12 = (byte *)((long)(iVar3 + iVar2) * ((long)(pNode->vFanins).nSize * 2 + 2) + 1);
        pbVar5 = (byte *)Mem_FlexEntryFetch(pMmMan,(int)pbVar12);
        pbVar6 = pbVar5;
        for (pbVar9 = (byte *)pSop0; bVar11 = *pbVar9, pbVar7 = pbVar6, pbVar10 = (byte *)pSop1,
            pbVar8 = pbVar9, bVar11 != 0; pbVar9 = pbVar9 + (long)(pNode->vFanins).nSize + 3) {
          while( true ) {
            pbVar6 = pbVar7 + 2;
            if ((bVar11 & 0xdf) == 0) break;
            *pbVar7 = bVar11;
            pbVar7[1] = 0x20;
            bVar11 = pbVar8[1];
            pbVar7 = pbVar6;
            pbVar8 = pbVar8 + 1;
          }
          pbVar7[0] = 0x30;
          pbVar7[1] = 10;
        }
        for (; bVar11 = *pbVar10, pbVar8 = pbVar6, pbVar9 = pbVar10, bVar11 != 0;
            pbVar10 = pbVar10 + (long)(pNode->vFanins).nSize + 3) {
          while( true ) {
            pbVar6 = pbVar8 + 2;
            if ((bVar11 & 0xdf) == 0) break;
            *pbVar8 = bVar11;
            pbVar8[1] = 0x20;
            bVar11 = pbVar9[1];
            pbVar8 = pbVar6;
            pbVar9 = pbVar9 + 1;
          }
          pbVar8[0] = 0x31;
          pbVar8[1] = 10;
        }
        *pbVar6 = 0;
        if (pbVar6 + (1 - (long)pbVar5) != pbVar12) {
          __assert_fail("pCur - pBlifMv == nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                        ,0x3ee,"int Abc_NtkConvertToBlifMv(Abc_Ntk_t *)");
        }
        Cudd_RecursiveDeref((DdManager *)pNtk->pManFunc,(DdNode *)(pNode->field_5).pData);
        (pNode->field_5).pData = pbVar5;
      }
    }
    pNtk->ntkFunc = ABC_FUNC_BLIFMV;
    Cudd_Quit((DdManager *)pNtk->pManFunc);
    pNtk->pManFunc = pMmMan;
    free(vCube->pArray);
    free(vCube);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_NtkConvertToBlifMv( Abc_Ntk_t * pNtk )
{
#ifdef ABC_USE_CUDD
    Mem_Flex_t * pMmFlex;
    Abc_Obj_t * pNode;
    Vec_Str_t * vCube;
    char * pSop0, * pSop1, * pBlifMv, * pCube, * pCur;
    int Value, nCubes, nSize, i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    if ( !Abc_NtkToBdd(pNtk) )
    {
        printf( "Converting logic functions to BDDs has failed.\n" );
        return 0;
    }

    pMmFlex = Mem_FlexStart();
    vCube   = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // convert BDD into cubes for on-set and off-set
        Abc_NodeBddToCnf( pNode, pMmFlex, vCube, 0, &pSop0, &pSop1 );
        // allocate room for the MV-SOP
        nCubes = Abc_SopGetCubeNum(pSop0) + Abc_SopGetCubeNum(pSop1);
        nSize = nCubes*(2*Abc_ObjFaninNum(pNode) + 2)+1;
        pBlifMv = Mem_FlexEntryFetch( pMmFlex, nSize );
        // add the cubes
        pCur = pBlifMv;
        Abc_SopForEachCube( pSop0, Abc_ObjFaninNum(pNode), pCube )
        {
            Abc_CubeForEachVar( pCube, Value, k )
            {
                *pCur++ = Value;
                *pCur++ = ' ';
            }
            *pCur++ = '0';
            *pCur++ = '\n';
        }
        Abc_SopForEachCube( pSop1, Abc_ObjFaninNum(pNode), pCube )
        {
            Abc_CubeForEachVar( pCube, Value, k )
            {
                *pCur++ = Value;
                *pCur++ = ' ';
            }
            *pCur++ = '1';
            *pCur++ = '\n';
        }
        *pCur++ = 0;
        assert( pCur - pBlifMv == nSize );
        // update the node representation
        Cudd_RecursiveDeref( (DdManager *)pNtk->pManFunc, (DdNode *)pNode->pData );
        pNode->pData = pBlifMv;
    }

    // update the functionality type
    pNtk->ntkFunc = ABC_FUNC_BLIFMV;
    Cudd_Quit( (DdManager *)pNtk->pManFunc );
    pNtk->pManFunc = pMmFlex;

    Vec_StrFree( vCube );
#endif
    return 1;
}